

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O1

void __thiscall HighsSparseVectorSum::clear(HighsSparseVectorSum *this)

{
  pointer pHVar1;
  int *piVar2;
  pointer pHVar3;
  pointer piVar4;
  iterator __begin2;
  int *piVar5;
  size_type __n;
  value_type local_18;
  
  piVar2 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar3 = (this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)(this->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
              .super__Vector_impl_data._M_finish - (long)pHVar3 >> 4;
  if ((ulong)(((long)piVar2 - (long)piVar5 >> 1) * 5) < __n * 3) {
    for (; piVar5 != piVar2; piVar5 = piVar5 + 1) {
      pHVar1 = pHVar3 + *piVar5;
      pHVar1->hi = 0.0;
      pHVar1->lo = 0.0;
    }
  }
  else {
    local_18.hi = 0.0;
    local_18.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&this->values,__n,&local_18);
  }
  piVar4 = (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar4) {
    (this->nonzeroinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4;
  }
  return;
}

Assistant:

void clear() {
    if (10 * nonzeroinds.size() < 3 * values.size())
      for (HighsInt i : nonzeroinds) values[i] = 0.0;
    else
      values.assign(values.size(), false);

    nonzeroinds.clear();
  }